

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageLoader::~CVmImageLoader(CVmImageLoader *this)

{
  char **ppcVar1;
  CVmRuntimeSymbols *pCVar2;
  CVmHashTable *pCVar3;
  long lVar4;
  CVmStaticInitPage *pCVar5;
  
  lVar4 = 8;
  do {
    if (*(long **)(this->timestamp_ + lVar4 * 8 + -0x24) != (long *)0x0) {
      (**(code **)(**(long **)(this->timestamp_ + lVar4 * 8 + -0x24) + 8))();
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 == 9);
  lib_free_str(this->fname_);
  lib_free_str(this->path_);
  pCVar2 = this->runtime_symtab_;
  if (pCVar2 != (CVmRuntimeSymbols *)0x0) {
    CVmRuntimeSymbols::~CVmRuntimeSymbols(pCVar2);
    operator_delete(pCVar2,0x18);
  }
  pCVar2 = this->runtime_macros_;
  if (pCVar2 != (CVmRuntimeSymbols *)0x0) {
    CVmRuntimeSymbols::~CVmRuntimeSymbols(pCVar2);
    operator_delete(pCVar2,0x18);
  }
  pCVar3 = this->exports_;
  if (pCVar3 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar3);
    operator_delete(pCVar3,0x20);
  }
  pCVar3 = this->synth_exports_;
  if (pCVar3 != (CVmHashTable *)0x0) {
    CVmHashTable::~CVmHashTable(pCVar3);
    operator_delete(pCVar3,0x20);
  }
  pCVar5 = this->static_head_;
  while (pCVar5 != (CVmStaticInitPage *)0x0) {
    ppcVar1 = &pCVar5->data_;
    pCVar5 = pCVar5->nxt_;
    (*this->fp_->_vptr_CVmImageFile[6])(this->fp_,*ppcVar1);
    if (this->static_head_ != (CVmStaticInitPage *)0x0) {
      operator_delete(this->static_head_,0x18);
    }
    this->static_head_ = pCVar5;
  }
  return;
}

Assistant:

CVmImageLoader::~CVmImageLoader()
{
    size_t i;

    /* delete the pool tracking objects */
    for (i = 0 ; i < sizeof(pools_)/sizeof(pools_[0]) ; ++i)
        delete pools_[i];

    /* delete the filename string and path */
    lib_free_str(fname_);
    lib_free_str(path_);

    /* if we have our own runtime symbol/macro tables, delete them */
    if (runtime_symtab_ != 0)
        delete runtime_symtab_;
    if (runtime_macros_ != 0)
        delete runtime_macros_;

    /* delete the exports tables */
    delete exports_;
    delete synth_exports_;

    /* delete the static initializer pages */
    while (static_head_ != 0)
    {
        CVmStaticInitPage *nxt;
        
        /* remember the next one */
        nxt = static_head_->nxt_;

        /* free the image-allocated data associated with the page */
        fp_->free_mem(static_head_->data_);

        /* delete this one */
        delete static_head_;

        /* move on to the next */
        static_head_ = nxt;
    }
}